

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O3

void HorizontalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  uint8_t uVar1;
  uint8_t uVar2;
  long lVar3;
  int iVar4;
  uint8_t *preds;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  
  uVar2 = *data;
  *filtered_data = uVar2;
  if (1 < width) {
    uVar5 = 0;
    do {
      filtered_data[uVar5 + 1] = data[uVar5 + 1] - data[uVar5];
      uVar5 = uVar5 + 1;
    } while (width - 1 != uVar5);
  }
  if (1 < height) {
    lVar3 = (long)stride;
    puVar6 = filtered_data + lVar3 + 1;
    puVar7 = data + lVar3 + 1;
    iVar4 = 1;
    do {
      uVar1 = data[lVar3];
      filtered_data[lVar3] = uVar1 - uVar2;
      if (1 < width) {
        uVar5 = 0;
        do {
          puVar6[uVar5] = puVar7[uVar5] - puVar7[uVar5 - 1];
          uVar5 = uVar5 + 1;
        } while (width - 1 != uVar5);
      }
      data = data + lVar3;
      filtered_data = filtered_data + lVar3;
      iVar4 = iVar4 + 1;
      puVar6 = puVar6 + lVar3;
      puVar7 = puVar7 + lVar3;
      uVar2 = uVar1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoHorizontalFilter_C(const uint8_t* WEBP_RESTRICT in,
                                             int width, int height, int stride,
                                             uint8_t* WEBP_RESTRICT out) {
  const uint8_t* preds = in;
  int row;
  DCHECK(in, out);

  // Leftmost pixel is the same as input for topmost scanline.
  out[0] = in[0];
  PredictLine_C(in + 1, preds, out + 1, width - 1);
  preds += stride;
  in += stride;
  out += stride;

  // Filter line-by-line.
  for (row = 1; row < height; ++row) {
    // Leftmost pixel is predicted from above.
    PredictLine_C(in, preds - stride, out, 1);
    PredictLine_C(in + 1, preds, out + 1, width - 1);
    preds += stride;
    in += stride;
    out += stride;
  }
}